

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher-chachapoly.c
# Opt level: O3

int chachapoly_get_length(chachapoly_ctx *ctx,uint *plenp,uint seqnr,uchar *cp,uint len)

{
  uint32_t uVar1;
  int iVar2;
  u_char buf [4];
  u_char seqbuf [8];
  uchar local_3c [4];
  u8 *local_38;
  u8 local_30 [8];
  
  iVar2 = -1;
  if (3 < len) {
    local_38 = local_30;
    _libssh2_store_u64(&local_38,(ulong)seqnr);
    iVar2 = 0;
    chacha_ivsetup(&ctx->header_ctx,local_30,(u8 *)0x0);
    chacha_encrypt_bytes(&ctx->header_ctx,cp,local_3c,4);
    uVar1 = _libssh2_ntohu32(local_3c);
    *plenp = uVar1;
  }
  return iVar2;
}

Assistant:

int
chachapoly_get_length(struct chachapoly_ctx *ctx, unsigned int *plenp,
                      unsigned int seqnr, const unsigned char *cp,
                      unsigned int len)
{
    u_char buf[4], seqbuf[8];
    unsigned char *ptr = NULL;

    if(len < 4)
        return -1;
    ptr = &seqbuf[0];
    _libssh2_store_u64(&ptr, seqnr);
    chacha_ivsetup(&ctx->header_ctx, seqbuf, NULL);
    chacha_encrypt_bytes(&ctx->header_ctx, cp, buf, 4);
    *plenp = _libssh2_ntohu32(buf);
    return 0;
}